

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O0

void __thiscall MppDevServer::~MppDevServer(MppDevServer *this)

{
  undefined4 local_14;
  RK_S32 i;
  MppDevServer *this_local;
  
  for (local_14 = VPU_CLIENT_VDPU1; (int)local_14 < 0x1e; local_14 = local_14 + VPU_CLIENT_VDPU2) {
    bat_server_put(this,local_14);
  }
  clear(this);
  Mutex::~Mutex(&this->super_Mutex);
  return;
}

Assistant:

MppDevServer::~MppDevServer()
{
    RK_S32 i;

    for (i = 0; i < VPU_CLIENT_BUTT; i++)
        bat_server_put((MppClientType)i);

    clear();
}